

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters.cc
# Opt level: O3

void __thiscall xLearn::Model::set_value(Model *this)

{
  real_t *prVar1;
  float fVar2;
  uint uVar3;
  real_t *prVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  byte bVar24;
  int iVar25;
  int iVar26;
  uint uVar27;
  ulong uVar28;
  ulong uVar29;
  uint uVar30;
  uint uVar31;
  long lVar32;
  uint uVar33;
  index_t iVar34;
  uint uVar35;
  float *pfVar36;
  ushort uVar37;
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  float fVar44;
  undefined1 auVar45 [16];
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM6_Qb;
  default_random_engine generator;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_38;
  
  local_38._M_x = 1;
  uVar27 = this->param_num_w_;
  if (uVar27 == 0) {
    uVar35 = this->aux_size_;
  }
  else {
    uVar35 = this->aux_size_;
    prVar4 = this->param_w_;
    uVar31 = 1;
    uVar30 = 0;
    do {
      prVar4[uVar30] = 0.0;
      lVar32 = (ulong)uVar35 - 1;
      uVar33 = uVar31;
      if (1 < uVar35) {
        do {
          uVar28 = (ulong)uVar33;
          uVar33 = uVar33 + 1;
          lVar32 = lVar32 + -1;
          prVar4[uVar28] = 1.0;
        } while (lVar32 != 0);
      }
      uVar30 = uVar30 + uVar35;
      uVar31 = uVar31 + uVar35;
    } while (uVar30 < uVar27);
  }
  prVar4 = this->param_b_;
  *prVar4 = 0.0;
  if (1 < uVar35) {
    auVar38 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
    auVar39 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar40 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar41 = vpbroadcastq_avx512f();
    uVar28 = 0;
    do {
      auVar42 = vpbroadcastq_avx512f();
      auVar43 = vporq_avx512f(auVar42,auVar39);
      auVar42 = vporq_avx512f(auVar42,auVar40);
      uVar19 = vpcmpuq_avx512f(auVar42,auVar41,2);
      uVar20 = vpcmpuq_avx512f(auVar43,auVar41,2);
      bVar24 = (byte)uVar20;
      uVar37 = CONCAT11(bVar24,(byte)uVar19);
      prVar1 = prVar4 + uVar28 + 1;
      bVar5 = (bool)((byte)uVar19 & 1);
      bVar6 = (bool)((byte)(uVar37 >> 1) & 1);
      bVar7 = (bool)((byte)(uVar37 >> 2) & 1);
      bVar8 = (bool)((byte)(uVar37 >> 3) & 1);
      bVar9 = (bool)((byte)(uVar37 >> 4) & 1);
      bVar10 = (bool)((byte)(uVar37 >> 5) & 1);
      bVar11 = (bool)((byte)(uVar37 >> 6) & 1);
      bVar12 = (bool)((byte)(uVar37 >> 7) & 1);
      bVar13 = (bool)(bVar24 >> 1 & 1);
      bVar14 = (bool)(bVar24 >> 2 & 1);
      bVar15 = (bool)(bVar24 >> 3 & 1);
      bVar16 = (bool)(bVar24 >> 4 & 1);
      bVar17 = (bool)(bVar24 >> 5 & 1);
      bVar18 = (bool)(bVar24 >> 6 & 1);
      *prVar1 = (real_t)((uint)bVar5 * auVar38._0_4_ | (uint)!bVar5 * (int)*prVar1);
      prVar1[1] = (real_t)((uint)bVar6 * auVar38._4_4_ | (uint)!bVar6 * (int)prVar1[1]);
      prVar1[2] = (real_t)((uint)bVar7 * auVar38._8_4_ | (uint)!bVar7 * (int)prVar1[2]);
      prVar1[3] = (real_t)((uint)bVar8 * auVar38._12_4_ | (uint)!bVar8 * (int)prVar1[3]);
      prVar1[4] = (real_t)((uint)bVar9 * auVar38._16_4_ | (uint)!bVar9 * (int)prVar1[4]);
      prVar1[5] = (real_t)((uint)bVar10 * auVar38._20_4_ | (uint)!bVar10 * (int)prVar1[5]);
      prVar1[6] = (real_t)((uint)bVar11 * auVar38._24_4_ | (uint)!bVar11 * (int)prVar1[6]);
      prVar1[7] = (real_t)((uint)bVar12 * auVar38._28_4_ | (uint)!bVar12 * (int)prVar1[7]);
      prVar1[8] = (real_t)((uint)(bVar24 & 1) * auVar38._32_4_ |
                          (uint)!(bool)(bVar24 & 1) * (int)prVar1[8]);
      prVar1[9] = (real_t)((uint)bVar13 * auVar38._36_4_ | (uint)!bVar13 * (int)prVar1[9]);
      prVar1[10] = (real_t)((uint)bVar14 * auVar38._40_4_ | (uint)!bVar14 * (int)prVar1[10]);
      prVar1[0xb] = (real_t)((uint)bVar15 * auVar38._44_4_ | (uint)!bVar15 * (int)prVar1[0xb]);
      prVar1[0xc] = (real_t)((uint)bVar16 * auVar38._48_4_ | (uint)!bVar16 * (int)prVar1[0xc]);
      prVar1[0xd] = (real_t)((uint)bVar17 * auVar38._52_4_ | (uint)!bVar17 * (int)prVar1[0xd]);
      prVar1[0xe] = (real_t)((uint)bVar18 * auVar38._56_4_ | (uint)!bVar18 * (int)prVar1[0xe]);
      prVar1[0xf] = (real_t)((uint)(bVar24 >> 7) * auVar38._60_4_ |
                            (uint)!(bool)(bVar24 >> 7) * (int)prVar1[0xf]);
      uVar28 = uVar28 + 0x10;
    } while (((ulong)uVar35 + 0xe & 0xfffffffffffffff0) != uVar28);
  }
  iVar25 = std::__cxx11::string::compare((char *)this);
  if (iVar25 == 0) {
    if (this->num_feat_ != 0) {
      iVar34 = this->num_K_;
      pfVar36 = this->param_v_;
      uVar35 = 0;
      auVar45._8_8_ = in_XMM6_Qb;
      auVar45._0_8_ = in_XMM6_Qa;
      auVar45 = vcvtusi2ss_avx512f(auVar45,iVar34);
      auVar45 = ZEXT416((uint)(auVar45._0_4_ * 0.25));
      auVar45 = vroundss_avx(auVar45,auVar45,10);
      iVar25 = vcvttss2usi_avx512f(auVar45);
      auVar23._8_8_ = in_XMM6_Qb;
      auVar23._0_8_ = in_XMM6_Qa;
      auVar45 = vcvtusi2sd_avx512f(auVar23,iVar34);
      auVar45 = vsqrtsd_avx(auVar45,auVar45);
      uVar27 = iVar25 * 4;
      fVar2 = this->scale_;
      do {
        if (iVar34 == 0) {
          iVar34 = 0;
        }
        else {
          uVar30 = 0;
          do {
            fVar44 = std::
                     generate_canonical<float,24ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                               (&local_38);
            uVar30 = uVar30 + 1;
            *pfVar36 = (fVar44 + 0.0) * (float)((1.0 / auVar45._0_8_) * (double)fVar2);
            pfVar36 = pfVar36 + 1;
            iVar34 = this->num_K_;
          } while (uVar30 < iVar34);
        }
        if (iVar34 < uVar27) {
          memset(pfVar36,0,(ulong)(~iVar34 + uVar27) * 4 + 4);
          pfVar36 = pfVar36 + (ulong)(~iVar34 + uVar27) + 1;
        }
        if (uVar27 < this->aux_size_ * uVar27) {
          iVar26 = (this->aux_size_ * 4 + -4) * iVar25;
          do {
            *pfVar36 = 1.0;
            pfVar36 = pfVar36 + 1;
            iVar26 = iVar26 + -1;
          } while (iVar26 != 0);
        }
        uVar35 = uVar35 + 1;
      } while (uVar35 < this->num_feat_);
    }
  }
  else {
    iVar25 = std::__cxx11::string::compare((char *)this);
    if ((iVar25 == 0) && (uVar27 = this->num_feat_, uVar27 != 0)) {
      pfVar36 = this->param_v_;
      uVar31 = 0;
      auVar21._8_8_ = in_XMM6_Qb;
      auVar21._0_8_ = in_XMM6_Qa;
      auVar45 = vcvtusi2ss_avx512f(auVar21,this->num_K_);
      auVar45 = ZEXT416((uint)(auVar45._0_4_ * 0.25));
      auVar45 = vroundss_avx(auVar45,auVar45,10);
      iVar25 = vcvttss2usi_avx512f(auVar45);
      auVar22._8_8_ = in_XMM6_Qb;
      auVar22._0_8_ = in_XMM6_Qa;
      auVar45 = vcvtusi2sd_avx512f(auVar22,this->num_K_);
      uVar35 = this->num_field_;
      auVar45 = vsqrtsd_avx(auVar45,auVar45);
      fVar2 = this->scale_;
      uVar30 = uVar35;
      do {
        if (uVar30 == 0) {
          uVar30 = 0;
        }
        else {
          uVar27 = 0;
          do {
            if (iVar25 << 2 != 0) {
              uVar33 = 4;
              uVar30 = 0;
              uVar35 = uVar30;
              do {
                do {
                  fVar44 = 0.0;
                  if (uVar30 < this->num_K_) {
                    fVar44 = std::
                             generate_canonical<float,24ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                                       (&local_38);
                    fVar44 = (fVar44 + 0.0) * (float)((1.0 / auVar45._0_8_) * (double)fVar2);
                  }
                  *pfVar36 = fVar44;
                  uVar3 = this->aux_size_;
                  if (1 < (ulong)uVar3) {
                    uVar28 = 4;
                    do {
                      uVar29 = uVar28 & 0xffffffff;
                      uVar28 = uVar28 + 4;
                      pfVar36[uVar29] = 1.0;
                    } while ((ulong)uVar3 * 4 - uVar28 != 0);
                  }
                  pfVar36 = pfVar36 + 1;
                  uVar30 = uVar30 + 1;
                } while (uVar30 != uVar33);
                uVar30 = uVar35 + 4;
                uVar33 = uVar33 + 4;
                pfVar36 = pfVar36 + (uVar3 * 4 - 4);
                uVar35 = uVar30;
              } while (uVar30 < (uint)(iVar25 << 2));
              uVar35 = this->num_field_;
            }
            uVar27 = uVar27 + 1;
          } while (uVar27 < uVar35);
          uVar27 = this->num_feat_;
          uVar30 = uVar35;
        }
        uVar31 = uVar31 + 1;
      } while (uVar31 < uVar27);
    }
  }
  return;
}

Assistant:

void Model::set_value() {
  // Use distribution to transform the random unsigned
  // int generated by gen into a float in [(0.0, 1.0) * coef]
  std::default_random_engine generator;
  std::uniform_real_distribution<real_t> dis(0.0, 1.0);
  /*********************************************************
   *  Initialize linear and bias term                      *
   *********************************************************/
  for (index_t i = 0; i < param_num_w_; i += aux_size_) {
    param_w_[i] = 0.0;        /* model */
    for (index_t j = 1; j < aux_size_; ++j) {
      param_w_[i+j] = 1.0;    /* gradient cache */
    }
  }
  param_b_[0] = 0.0;      /* model */
  for (index_t j = 1; j < aux_size_; ++j) {
    param_b_[j] = 1.0;    /* gradient cache */
  }
  /*********************************************************
   *  Initialize latent factor for fm                      *
   *********************************************************/
  if (score_func_.compare("fm") == 0) {
    index_t k_aligned = get_aligned_k();
    real_t coef = 1.0f / sqrt(num_K_) * scale_;
    real_t* w = param_v_;
    for (index_t j = 0; j < num_feat_; ++j) {
      for(index_t d = 0; d < num_K_; d++, w++) {
        *w = coef * dis(generator);  /* model */
      }
      for(index_t d = num_K_; d < k_aligned; d++, w++) {
        *w = 0;  /* Beyond aligned number */
      }
      for(index_t d = k_aligned; d < aux_size_*k_aligned; d++, w++) {
        *w = 1.0;  /* gradient cache */
      }
    }
  }
  /*********************************************************
   *  Initialize latent factor for ffm                     *
   *********************************************************/
  else if (score_func_.compare("ffm") == 0) {
    index_t k_aligned = get_aligned_k();
    real_t* w = param_v_;
    real_t coef = 1.0f / sqrt(num_K_) * scale_;
    for (index_t j = 0; j < num_feat_; ++j) {
      for (index_t f = 0; f < num_field_; ++f) {
        for (index_t d = 0; d < k_aligned; ) {
          for (index_t s = 0; s < kAlign; s++, w++, d++) {
            w[0] = (d < num_K_) ? coef * dis(generator) : 0.0; /* model */
            for (index_t j = 1; j < aux_size_; ++j) {
              w[kAlign * j] = 1.0; /* gradient cache */
            }
          }
          w += (aux_size_-1) * kAlign;
        }
      }
    }
  }
}